

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linuxaio_queue.cpp
# Opt level: O2

void __thiscall foxxll::linuxaio_queue::post_requests(linuxaio_queue *this)

{
  semaphore *this_00;
  queue_type *this_01;
  semaphore *this_02;
  _List_node_base *p_Var1;
  bool bVar2;
  __pid_t _Var3;
  value_type vVar4;
  linuxaio_request *this_03;
  iocb *piVar5;
  long lVar6;
  ostream *poVar7;
  int *piVar8;
  char *pcVar9;
  io_error *piVar10;
  __sighandler_t __handler;
  __sighandler_t __handler_00;
  __sighandler_t __handler_01;
  int iVar11;
  size_t i;
  ulong uVar13;
  request_ptr req;
  vector<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
  reqs;
  simple_vector<iocb_*> cbs;
  unique_lock<std::mutex> lock;
  simple_vector<io_event> events;
  string local_1c8;
  request_ptr req_1;
  mutex *pmVar12;
  
  req_1.ptr_ = (request *)(long)this->max_events_;
  tlx::SimpleVector<io_event,_(tlx::SimpleVectorMode)0>::SimpleVector(&events,(size_type *)&req_1);
  this_00 = &this->num_waiting_requests_;
  this_01 = &this->waiting_requests_;
  this_02 = &this->num_free_events_;
  do {
    _Var3 = tlx::Semaphore::wait(this_00,(void *)0x1);
    vVar4 = shared_state<foxxll::request_queue_impl_worker::thread_state>::operator()
                      (&this->post_thread_state_);
    if (_Var3 == 0 && vVar4 == TERMINATING) {
      tlx::SimpleVector<io_event,_(tlx::SimpleVectorMode)0>::~SimpleVector(&events);
      return;
    }
    pmVar12 = &this->waiting_mtx_;
    std::unique_lock<std::mutex>::unique_lock(&lock,&this->waiting_mtx_);
    iVar11 = (int)pmVar12;
    p_Var1 = (this_01->
             super__List_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
             )._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var1 == (_List_node_base *)this_01) {
      std::unique_lock<std::mutex>::unlock(&lock);
      tlx::Semaphore::signal(this_00,iVar11,__handler_01);
    }
    else {
      reqs.
      super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      reqs.
      super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      reqs.
      super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      req.ptr_ = (request *)p_Var1[1]._M_next;
      if (req.ptr_ != (request *)0x0) {
        LOCK();
        ((req.ptr_)->super_reference_counter).reference_count_.super___atomic_base<unsigned_long>.
        _M_i = (__int_type)
               ((long)&((_List_node_base *)
                       ((req.ptr_)->super_reference_counter).reference_count_.
                       super___atomic_base<unsigned_long>._M_i)->_M_next + 1);
        UNLOCK();
      }
      std::__cxx11::
      list<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
      ::pop_front(this_01);
      std::
      vector<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>,std::allocator<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>>>
      ::emplace_back<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>>
                ((vector<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>,std::allocator<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>>>
                  *)&reqs,&req);
      while( true ) {
        if (((this_01->
             super__List_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
             )._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)this_01) ||
           (bVar2 = tlx::Semaphore::try_acquire(this_02,1,1), !bVar2)) goto LAB_0014874b;
        iVar11 = 1;
        bVar2 = tlx::Semaphore::try_acquire(this_00,1,0);
        if (!bVar2) break;
        req_1.ptr_ = (request *)
                     (this_01->
                     super__List_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                     )._M_impl._M_node.super__List_node_base._M_next[1]._M_next;
        if (req_1.ptr_ != (request *)0x0) {
          LOCK();
          ((req_1.ptr_)->super_reference_counter).reference_count_.
          super___atomic_base<unsigned_long>._M_i =
               (__int_type)
               ((long)&((_List_node_base *)
                       ((req_1.ptr_)->super_reference_counter).reference_count_.
                       super___atomic_base<unsigned_long>._M_i)->_M_next + 1);
          UNLOCK();
        }
        std::__cxx11::
        list<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
        ::pop_front(this_01);
        std::
        vector<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>,std::allocator<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>>>
        ::emplace_back<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>>
                  ((vector<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>,std::allocator<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>>>
                    *)&reqs,&req_1);
        tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::dec_reference(&req_1);
      }
      tlx::Semaphore::signal(this_02,iVar11,__handler);
LAB_0014874b:
      std::unique_lock<std::mutex>::unlock(&lock);
      tlx::Semaphore::wait(this_02,(void *)0x1);
      req_1.ptr_ = (request *)
                   ((long)reqs.
                          super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)reqs.
                          super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3);
      tlx::SimpleVector<iocb_*,_(tlx::SimpleVectorMode)0>::SimpleVector(&cbs,(size_type *)&req_1);
      for (uVar13 = 0;
          uVar13 < (ulong)((long)reqs.
                                 super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)reqs.
                                 super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
          uVar13 = uVar13 + 1) {
        this_03 = (linuxaio_request *)
                  __dynamic_cast(reqs.
                                 super__Vector_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar13].ptr_,
                                 &request::typeinfo,&linuxaio_request::typeinfo,0);
        piVar5 = linuxaio_request::fill_control_block(this_03);
        cbs.array_[uVar13] = piVar5;
      }
      std::
      vector<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
      ::clear(&reqs);
      uVar13 = 0;
      while (uVar13 <= cbs.size_ && cbs.size_ - uVar13 != 0) {
        lVar6 = syscall(0xd1,this->context_,cbs.size_ - uVar13,cbs.array_ + uVar13);
        if (lVar6 < 1) {
          piVar8 = __errno_location();
          if (*piVar8 != 0xb) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&req_1);
            poVar7 = std::operator<<((ostream *)&req_1,"Error in ");
            poVar7 = std::operator<<(poVar7,"void foxxll::linuxaio_queue::post_requests()");
            poVar7 = std::operator<<(poVar7," : ");
            poVar7 = std::operator<<(poVar7,"linuxaio_request::post io_submit()");
            poVar7 = std::operator<<(poVar7," : ");
            pcVar9 = strerror(*piVar8);
            std::operator<<(poVar7,pcVar9);
            piVar10 = (io_error *)__cxa_allocate_exception(0x20);
            std::__cxx11::stringbuf::str();
            io_error::io_error(piVar10,&local_1c8);
            __cxa_throw(piVar10,&io_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
          }
        }
        else {
          tlx::Semaphore::signal(&this->num_posted_requests_,(int)lVar6,__handler_00);
          uVar13 = uVar13 + lVar6;
          if (uVar13 == cbs.size_) break;
        }
        lVar6 = syscall(0xd0,this->context_,0,(ulong)(uint)this->max_events_,events.array_,0);
        if (lVar6 < 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&req_1);
          poVar7 = std::operator<<((ostream *)&req_1,"Error in ");
          poVar7 = std::operator<<(poVar7,"void foxxll::linuxaio_queue::post_requests()");
          poVar7 = std::operator<<(poVar7," : ");
          poVar7 = std::operator<<(poVar7,"linuxaio_queue::post_requests io_getevents() nr_events=")
          ;
          poVar7 = std::ostream::_M_insert<long>((long)poVar7);
          poVar7 = std::operator<<(poVar7," : ");
          piVar8 = __errno_location();
          pcVar9 = strerror(*piVar8);
          std::operator<<(poVar7,pcVar9);
          piVar10 = (io_error *)__cxa_allocate_exception(0x20);
          std::__cxx11::stringbuf::str();
          io_error::io_error(piVar10,&local_1c8);
          __cxa_throw(piVar10,&io_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
        }
        if (lVar6 != 0) {
          handle_events(this,events.array_,lVar6,false);
        }
      }
      tlx::SimpleVector<iocb_*,_(tlx::SimpleVectorMode)0>::~SimpleVector(&cbs);
      tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::dec_reference(&req);
      std::
      vector<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
      ::~vector(&reqs);
    }
    std::unique_lock<std::mutex>::~unique_lock(&lock);
  } while( true );
}

Assistant:

void linuxaio_queue::post_requests()
{
    tlx::simple_vector<io_event> events(max_events_);

    for ( ; ; ) // as long as thread is running
    {
        // block until next request or message comes in
        int num_currently_waiting_requests = num_waiting_requests_.wait();

        // terminate if termination has been requested
        if (post_thread_state_() == TERMINATING &&
            num_currently_waiting_requests == 0)
            break;

        std::unique_lock<std::mutex> lock(waiting_mtx_);
        if (TLX_UNLIKELY(waiting_requests_.empty())) {
            // unlock queue
            lock.unlock();

            // num_waiting_requests_-- was premature, compensate for that
            num_waiting_requests_.signal();
            continue;
        }

        // collect requests from waiting queue: first is there
        std::vector<request_ptr> reqs;

        request_ptr req = waiting_requests_.front();
        waiting_requests_.pop_front();
        reqs.emplace_back(std::move(req));

        // collect additional requests
        while (!waiting_requests_.empty()) {
            // acquire one free event, but keep one in slack
            if (!num_free_events_.try_acquire(/* delta */ 1, /* slack */ 1))
                break;
            if (!num_waiting_requests_.try_acquire()) {
                num_free_events_.signal();
                break;
            }

            request_ptr req = waiting_requests_.front();
            waiting_requests_.pop_front();
            reqs.emplace_back(std::move(req));
        }

        lock.unlock();

        // the last free_event must be acquired outside of the lock.
        num_free_events_.wait();

        // construct batch iocb
        tlx::simple_vector<iocb*> cbs(reqs.size());

        for (size_t i = 0; i < reqs.size(); ++i) {
            // polymorphic_downcast
            auto ar = dynamic_cast<linuxaio_request*>(reqs[i].get());
            cbs[i] = ar->fill_control_block();
        }
        reqs.clear();

        // io_submit loop
        size_t cb_done = 0;
        while (cb_done < cbs.size()) {
            long success = syscall(
                    SYS_io_submit, context_,
                    cbs.size() - cb_done,
                    cbs.data() + cb_done
                );

            if (success <= 0 && errno != EAGAIN) {
                FOXXLL_THROW_ERRNO(
                    io_error, "linuxaio_request::post io_submit()"
                );
            }
            if (success > 0) {
                // request is posted
                num_posted_requests_.signal(success);

                cb_done += success;
                if (cb_done == cbs.size())
                    break;
            }

            // post failed, so first handle events to make queues (more) empty,
            // then try again.

            // wait for at least one event to complete, no time limit
            long num_events = syscall(
                    SYS_io_getevents, context_, 0,
                    max_events_, events.data(), nullptr
                );
            if (num_events < 0) {
                FOXXLL_THROW_ERRNO(
                    io_error, "linuxaio_queue::post_requests"
                    " io_getevents() nr_events=" << num_events
                );
            }
            if (num_events > 0)
                handle_events(events.data(), num_events, false);
        }
    }
}